

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O0

JSON * chaiscript::json_wrap::to_json_object(JSON *__return_storage_ptr__,Boxed_Value *t_bv)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *pmVar2;
  JSON *this;
  bad_boxed_cast *anon_var_0_5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  *attr;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *__range2_1;
  Dynamic_Object *o_1;
  bad_boxed_cast *anon_var_0_4;
  bad_boxed_cast *anon_var_0_3;
  bad_any_cast *anon_var_0_2;
  Boxed_Number bn;
  bad_boxed_cast *anon_var_0_1;
  size_t i;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> v;
  bad_boxed_cast *anon_var_0;
  reference local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  *o;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  *__range2;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  m;
  Boxed_Value *t_bv_local;
  JSON *obj;
  
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)t_bv;
  pmVar2 = boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>const&>
                     (t_bv,(Type_Conversions_State *)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         *)local_48,pmVar2);
  json::JSON::JSON(__return_storage_ptr__,Object);
  __end2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                    *)local_48);
  o = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
                *)local_48);
  while (bVar1 = std::operator==(&__end2,(_Self *)&o), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_78 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
               ::operator*(&__end2);
    to_json_object((JSON *)&anon_var_0,&local_78->second);
    this = json::JSON::operator[](__return_storage_ptr__,&local_78->first);
    json::JSON::operator=(this,(JSON *)&anon_var_0);
    json::JSON::~JSON((JSON *)&anon_var_0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>
    ::operator++(&__end2);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
          *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static json::JSON to_json_object(const Boxed_Value &t_bv) {
      try {
        const std::map<std::string, Boxed_Value> m = chaiscript::boxed_cast<const std::map<std::string, Boxed_Value> &>(t_bv);

        json::JSON obj(json::JSON::Class::Object);
        for (const auto &o : m) {
          obj[o.first] = to_json_object(o.second);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a map
      }

      try {
        const std::vector<Boxed_Value> v = chaiscript::boxed_cast<const std::vector<Boxed_Value> &>(t_bv);

        json::JSON obj(json::JSON::Class::Array);
        for (size_t i = 0; i < v.size(); ++i) {
          obj[i] = to_json_object(v[i]);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a vector
      }

      try {
        Boxed_Number bn(t_bv);
        if (Boxed_Number::is_floating_point(t_bv)) {
          return json::JSON(bn.get_as<double>());
        } else {
          return json::JSON(bn.get_as<std::int64_t>());
        }
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
        // not a number
      }

      try {
        return json::JSON(boxed_cast<bool>(t_bv));
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a bool
      }

      try {
        return json::JSON(boxed_cast<std::string>(t_bv));
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a string
      }

      try {
        const chaiscript::dispatch::Dynamic_Object &o = boxed_cast<const dispatch::Dynamic_Object &>(t_bv);

        json::JSON obj(json::JSON::Class::Object);
        for (const auto &attr : o.get_attrs()) {
          obj[attr.first] = to_json_object(attr.second);
        }
        return obj;
      } catch (const chaiscript::exception::bad_boxed_cast &) {
        // not a dynamic object
      }

      if (t_bv.is_null())
        return json::JSON(); // a null value

      throw std::runtime_error("Unknown object type to convert to JSON");
    }